

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O0

uint64_t poplar::vbyte::encode(uint8_t *codes,uint64_t val)

{
  uint64_t i;
  uint64_t val_local;
  uint8_t *codes_local;
  
  i = 0;
  for (val_local = val; 0x7f < val_local; val_local = val_local >> 7) {
    codes[i] = (byte)val_local & 0x7f | 0x80;
    i = i + 1;
  }
  codes[i] = (byte)val_local & 0x7f;
  return i + 1;
}

Assistant:

inline uint64_t encode(uint8_t* codes, uint64_t val) {
    uint64_t i = 0;
    while (127ULL < val) {
        codes[i++] = static_cast<uint8_t>((val & 127ULL) | 0x80ULL);
        val >>= 7;
    }
    codes[i++] = static_cast<uint8_t>(val & 127ULL);
    return i;
}